

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O0

void __thiscall
Altumo::FastCgi::Server::handle_accept(Server *this,Session *new_session,error_code *error)

{
  bool bVar1;
  error_code *error_local;
  Session *new_session_local;
  Server *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(error);
  if (bVar1) {
    if (new_session != (Session *)0x0) {
      Session::~Session(new_session);
      operator_delete(new_session,0x6a0);
    }
  }
  else {
    Session::start(new_session);
  }
  start_accept(this);
  return;
}

Assistant:

void handle_accept( Session* new_session, const boost::system::error_code& error ){

                    if( !error ){
                        new_session->start();
                    }else{
                        delete new_session;
                    }

                    start_accept();

                }